

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O2

void do_connect(uv_loop_t *loop,uv_tcp_t *tcp_client)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    iVar1 = uv_tcp_init(loop,&::tcp_client);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_tcp_connect(&connect_req,&::tcp_client,(sockaddr *)&addr,connect_cb);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        return;
      }
      pcVar3 = "r";
      uVar2 = 199;
    }
    else {
      pcVar3 = "r";
      uVar2 = 0xc1;
    }
  }
  else {
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0xbe;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
          ,uVar2,pcVar3,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void do_connect(uv_loop_t* loop, uv_tcp_t* tcp_client) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, tcp_client);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     tcp_client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);
}